

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GetMemberOfVectorOfNonStruct
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  bool bVar1;
  size_t t;
  string local_200;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  Type vectortype;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  vectortype._24_8_ = code_ptr;
  Type::VectorType((Type *)local_50,&(field->value).type);
  GenReceiver(this,struct_def,code_ptr);
  IdlNamer::Function_abi_cxx11_(&local_90,&this->namer_,&field->super_Definition);
  std::operator+(&local_70," ",&local_90);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  TypeName_abi_cxx11_(&local_100,this,field);
  std::operator+(&local_e0,"(j int) ",&local_100);
  std::operator+(&local_c0,&local_e0," ");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  OffsetPrefix_abi_cxx11_(&local_120,this,field);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,"\t\ta := rcv._tab.Vector(o)\n");
  GenGetter_abi_cxx11_(&local_1e0,this,&(field->value).type);
  std::operator+(&local_1c0,&local_1e0,"(a + flatbuffers.UOffsetT(j*");
  t = InlineSize((Type *)local_50);
  NumToString<unsigned_long>(&local_200,t);
  std::operator+(&local_1a0,&local_1c0,&local_200);
  std::operator+(&local_180,&local_1a0,"))");
  CastToEnum(&local_160,this,&(field->value).type,&local_180);
  std::operator+(&local_140,"\t\treturn ",&local_160);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,"\n\t}\n");
  bVar1 = IsString((Type *)local_50);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,"\treturn nil\n");
  }
  else if (local_50._0_4_ == BASE_TYPE_BOOL) {
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,"\treturn false\n");
  }
  else {
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,"\treturn 0\n");
  }
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,"}\n\n");
  return;
}

Assistant:

void GetMemberOfVectorOfNonStruct(const StructDef &struct_def,
                                    const FieldDef &field,
                                    std::string *code_ptr) {
    std::string &code = *code_ptr;
    auto vectortype = field.value.type.VectorType();

    GenReceiver(struct_def, code_ptr);
    code += " " + namer_.Function(field);
    code += "(j int) " + TypeName(field) + " ";
    code += OffsetPrefix(field);
    code += "\t\ta := rcv._tab.Vector(o)\n";
    code += "\t\treturn " +
            CastToEnum(field.value.type,
                       GenGetter(field.value.type) +
                           "(a + flatbuffers.UOffsetT(j*" +
                           NumToString(InlineSize(vectortype)) + "))");
    code += "\n\t}\n";
    if (IsString(vectortype)) {
      code += "\treturn nil\n";
    } else if (vectortype.base_type == BASE_TYPE_BOOL) {
      code += "\treturn false\n";
    } else {
      code += "\treturn 0\n";
    }
    code += "}\n\n";
  }